

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerSafe::SetActiveDataset
          (CommissionerSafe *this,ErrorHandler *aHandler,ActiveOperationalDataset *aDataset)

{
  _func_void *p_Var1;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  CommissionerSafe *local_128;
  _Any_data local_120;
  long local_110;
  undefined8 uStack_108;
  ActiveOperationalDataset local_100;
  
  local_128 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_120,aHandler);
  ActiveOperationalDataset::ActiveOperationalDataset(&local_100,aDataset);
  local_138 = (code *)0x0;
  pcStack_130 = (code *)0x0;
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  p_Var1 = (_func_void *)operator_new(0x100);
  *(CommissionerSafe **)p_Var1 = local_128;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = uStack_108;
  if (local_110 != 0) {
    *(void **)(p_Var1 + 8) = local_120._M_unused._M_object;
    *(undefined8 *)(p_Var1 + 0x10) = local_120._8_8_;
    *(long *)(p_Var1 + 0x18) = local_110;
    local_110 = 0;
    uStack_108 = 0;
  }
  ActiveOperationalDataset::ActiveOperationalDataset
            ((ActiveOperationalDataset *)(p_Var1 + 0x28),&local_100);
  pcStack_130 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:335:22)>
                ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:335:22)>
              ::_M_manager;
  local_148._M_unused._0_8_ = (undefined8)p_Var1;
  PushAsyncRequest(this,(AsyncRequest *)&local_148);
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  SetActiveDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::ActiveOperationalDataset_const&)
  ::$_0::~__0((__0 *)&local_128);
  return;
}

Assistant:

void CommissionerSafe::SetActiveDataset(ErrorHandler aHandler, const ActiveOperationalDataset &aDataset)
{
    PushAsyncRequest([=]() { mImpl->SetActiveDataset(aHandler, aDataset); });
}